

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum.cc
# Opt level: O3

void TestAddUInt64(void)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uVar4;
  char *pcVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Vector<const_char> value;
  Vector<const_char> value_00;
  Vector<const_char> value_01;
  Vector<const_char> value_02;
  Vector<const_char> value_03;
  Vector<const_char> value_04;
  Vector<const_char> value_05;
  Vector<const_char> value_06;
  Vector<const_char> value_07;
  Vector<const_char> value_08;
  Vector<const_char> value_09;
  Vector<const_char> value_10;
  Vector<const_char> value_11;
  Vector<const_char> value_12;
  char buffer [1024];
  Bignum bignum;
  char local_628;
  char cStack_627;
  char cStack_626;
  char cStack_625;
  char cStack_624;
  char cStack_623;
  char cStack_622;
  char cStack_621;
  char cStack_620;
  char cStack_61f;
  char cStack_61e;
  char cStack_61d;
  char cStack_61c;
  char cStack_61b;
  char cStack_61a;
  char cStack_619;
  char cStack_618;
  char cStack_617;
  char cStack_616;
  char cStack_615;
  char cStack_614;
  char cStack_613;
  char cStack_612;
  char cStack_611;
  char cStack_610;
  char cStack_60f;
  char cStack_60e;
  Bignum local_224;
  
  local_224.used_bigits_ = 0;
  local_224.exponent_ = 0;
  value._8_8_ = 1;
  value.start_ = "0";
  double_conversion::Bignum::AssignHexString(&local_224,value);
  double_conversion::Bignum::AddUInt64(&local_224,10);
  bVar1 = double_conversion::Bignum::ToHexString(&local_224,&local_628,0x400);
  if (!bVar1) {
    uVar4 = 0xa3;
LAB_0081ed7d:
    printf("%s:%d:\n CHECK(%s) failed\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-bignum.cc"
           ,uVar4,"bignum.ToHexString(buffer, kBufferSize)");
    abort();
  }
  if (CONCAT11(cStack_627,local_628) == 0x41) {
    value_00._8_8_ = 1;
    value_00.start_ = "1";
    double_conversion::Bignum::AssignHexString(&local_224,value_00);
    double_conversion::Bignum::AddUInt64(&local_224,10);
    bVar1 = double_conversion::Bignum::ToHexString(&local_224,&local_628,0x400);
    if (!bVar1) {
      uVar4 = 0xa8;
      goto LAB_0081ed7d;
    }
    if (CONCAT11(cStack_627,local_628) == 0x42) {
      value_01._8_8_ = 1;
      value_01.start_ = "1";
      double_conversion::Bignum::AssignHexString(&local_224,value_01);
      double_conversion::Bignum::AddUInt64(&local_224,0x100);
      bVar1 = double_conversion::Bignum::ToHexString(&local_224,&local_628,0x400);
      if (!bVar1) {
        uVar4 = 0xad;
        goto LAB_0081ed7d;
      }
      if (CONCAT13(cStack_625,CONCAT12(cStack_626,CONCAT11(cStack_627,local_628))) == 0x313031) {
        value_02._8_8_ = 1;
        value_02.start_ = "1";
        double_conversion::Bignum::AssignHexString(&local_224,value_02);
        double_conversion::Bignum::AddUInt64(&local_224,0xffff);
        bVar1 = double_conversion::Bignum::ToHexString(&local_224,&local_628,0x400);
        if (!bVar1) {
          uVar4 = 0xb2;
          goto LAB_0081ed7d;
        }
        if (CONCAT11(cStack_623,cStack_624) == 0x30 &&
            CONCAT13(cStack_625,CONCAT12(cStack_626,CONCAT11(cStack_627,local_628))) == 0x30303031)
        {
          value_03._8_8_ = 7;
          value_03.start_ = "FFFFFFF";
          double_conversion::Bignum::AssignHexString(&local_224,value_03);
          double_conversion::Bignum::AddUInt64(&local_224,1);
          bVar1 = double_conversion::Bignum::ToHexString(&local_224,&local_628,0x400);
          if (!bVar1) {
            uVar4 = 0xb7;
            goto LAB_0081ed7d;
          }
          if (cStack_620 == '\0' &&
              CONCAT17(cStack_621,
                       CONCAT16(cStack_622,
                                CONCAT15(cStack_623,
                                         CONCAT14(cStack_624,
                                                  CONCAT13(cStack_625,
                                                           CONCAT12(cStack_626,
                                                                    CONCAT11(cStack_627,local_628)))
                                                 )))) == 0x3030303030303031) {
            value_04._8_8_ = 0x2c;
            value_04.start_ = "10000000000000000000000000000000000000000000";
            double_conversion::Bignum::AssignHexString(&local_224,value_04);
            double_conversion::Bignum::AddUInt64(&local_224,0xffff);
            bVar1 = double_conversion::Bignum::ToHexString(&local_224,&local_628,0x400);
            if (!bVar1) {
              uVar4 = 0xbc;
              goto LAB_0081ed7d;
            }
            iVar2 = bcmp("1000000000000000000000000000000000000000FFFF",&local_628,0x2d);
            if (iVar2 == 0) {
              value_05._8_8_ = 0x2c;
              value_05.start_ = "FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFF";
              double_conversion::Bignum::AssignHexString(&local_224,value_05);
              double_conversion::Bignum::AddUInt64(&local_224,1);
              bVar1 = double_conversion::Bignum::ToHexString(&local_224,&local_628,0x400);
              if (!bVar1) {
                uVar4 = 0xc1;
                goto LAB_0081ed7d;
              }
              iVar2 = bcmp("100000000000000000000000000000000000000000000",&local_628,0x2e);
              if (iVar2 == 0) {
                double_conversion::Bignum::AssignUInt16(&local_224,1);
                double_conversion::Bignum::ShiftLeft(&local_224,100);
                double_conversion::Bignum::AddUInt64(&local_224,1);
                bVar1 = double_conversion::Bignum::ToHexString(&local_224,&local_628,0x400);
                if (!bVar1) {
                  uVar4 = 199;
                  goto LAB_0081ed7d;
                }
                auVar10[0] = -(cStack_61d == '0');
                auVar10[1] = -(cStack_61c == '0');
                auVar10[2] = -(cStack_61b == '0');
                auVar10[3] = -(cStack_61a == '0');
                auVar10[4] = -(cStack_619 == '0');
                auVar10[5] = -(cStack_618 == '0');
                auVar10[6] = -(cStack_617 == '0');
                auVar10[7] = -(cStack_616 == '0');
                auVar10[8] = -(cStack_615 == '0');
                auVar10[9] = -(cStack_614 == '0');
                auVar10[10] = -(cStack_613 == '0');
                auVar10[0xb] = -(cStack_612 == '0');
                auVar10[0xc] = -(cStack_611 == '0');
                auVar10[0xd] = -(cStack_610 == '0');
                auVar10[0xe] = -(cStack_60f == '1');
                auVar10[0xf] = -(cStack_60e == '\0');
                auVar6[0] = -(local_628 == '1');
                auVar6[1] = -(cStack_627 == '0');
                auVar6[2] = -(cStack_626 == '0');
                auVar6[3] = -(cStack_625 == '0');
                auVar6[4] = -(cStack_624 == '0');
                auVar6[5] = -(cStack_623 == '0');
                auVar6[6] = -(cStack_622 == '0');
                auVar6[7] = -(cStack_621 == '0');
                auVar6[8] = -(cStack_620 == '0');
                auVar6[9] = -(cStack_61f == '0');
                auVar6[10] = -(cStack_61e == '0');
                auVar6[0xb] = -(cStack_61d == '0');
                auVar6[0xc] = -(cStack_61c == '0');
                auVar6[0xd] = -(cStack_61b == '0');
                auVar6[0xe] = -(cStack_61a == '0');
                auVar6[0xf] = -(cStack_619 == '0');
                auVar6 = auVar6 & auVar10;
                if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) == 0xffff) {
                  double_conversion::Bignum::AssignUInt16(&local_224,1);
                  double_conversion::Bignum::ShiftLeft(&local_224,100);
                  double_conversion::Bignum::AddUInt64(&local_224,0xffff);
                  bVar1 = double_conversion::Bignum::ToHexString(&local_224,&local_628,0x400);
                  if (!bVar1) {
                    uVar4 = 0xcd;
                    goto LAB_0081ed7d;
                  }
                  auVar7[0] = -(cStack_61d == '0');
                  auVar7[1] = -(cStack_61c == '0');
                  auVar7[2] = -(cStack_61b == '0');
                  auVar7[3] = -(cStack_61a == '0');
                  auVar7[4] = -(cStack_619 == '0');
                  auVar7[5] = -(cStack_618 == '0');
                  auVar7[6] = -(cStack_617 == '0');
                  auVar7[7] = -(cStack_616 == '0');
                  auVar7[8] = -(cStack_615 == '0');
                  auVar7[9] = -(cStack_614 == '0');
                  auVar7[10] = -(cStack_613 == '0');
                  auVar7[0xb] = -(cStack_612 == 'F');
                  auVar7[0xc] = -(cStack_611 == 'F');
                  auVar7[0xd] = -(cStack_610 == 'F');
                  auVar7[0xe] = -(cStack_60f == 'F');
                  auVar7[0xf] = -(cStack_60e == '\0');
                  auVar11[0] = -(local_628 == '1');
                  auVar11[1] = -(cStack_627 == '0');
                  auVar11[2] = -(cStack_626 == '0');
                  auVar11[3] = -(cStack_625 == '0');
                  auVar11[4] = -(cStack_624 == '0');
                  auVar11[5] = -(cStack_623 == '0');
                  auVar11[6] = -(cStack_622 == '0');
                  auVar11[7] = -(cStack_621 == '0');
                  auVar11[8] = -(cStack_620 == '0');
                  auVar11[9] = -(cStack_61f == '0');
                  auVar11[10] = -(cStack_61e == '0');
                  auVar11[0xb] = -(cStack_61d == '0');
                  auVar11[0xc] = -(cStack_61c == '0');
                  auVar11[0xd] = -(cStack_61b == '0');
                  auVar11[0xe] = -(cStack_61a == '0');
                  auVar11[0xf] = -(cStack_619 == '0');
                  auVar7 = auVar7 & auVar11;
                  if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                              (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) == 0xffff) {
                    value_06._8_8_ = 1;
                    value_06.start_ = "0";
                    double_conversion::Bignum::AssignHexString(&local_224,value_06);
                    double_conversion::Bignum::AddUInt64(&local_224,0xa00000000);
                    bVar1 = double_conversion::Bignum::ToHexString(&local_224,&local_628,0x400);
                    if (!bVar1) {
                      uVar4 = 0xd2;
                      goto LAB_0081ed7d;
                    }
                    if (CONCAT11(cStack_61f,cStack_620) == 0x30 &&
                        CONCAT17(cStack_621,
                                 CONCAT16(cStack_622,
                                          CONCAT15(cStack_623,
                                                   CONCAT14(cStack_624,
                                                            CONCAT13(cStack_625,
                                                                     CONCAT12(cStack_626,
                                                                              CONCAT11(cStack_627,
                                                                                       local_628))))
                                                  ))) == 0x3030303030303041) {
                      value_07._8_8_ = 1;
                      value_07.start_ = "1";
                      double_conversion::Bignum::AssignHexString(&local_224,value_07);
                      double_conversion::Bignum::AddUInt64(&local_224,0xa00000000);
                      bVar1 = double_conversion::Bignum::ToHexString(&local_224,&local_628,0x400);
                      if (!bVar1) {
                        uVar4 = 0xd7;
                        goto LAB_0081ed7d;
                      }
                      if (CONCAT11(cStack_61f,cStack_620) == 0x31 &&
                          CONCAT17(cStack_621,
                                   CONCAT16(cStack_622,
                                            CONCAT15(cStack_623,
                                                     CONCAT14(cStack_624,
                                                              CONCAT13(cStack_625,
                                                                       CONCAT12(cStack_626,
                                                                                CONCAT11(cStack_627,
                                                                                         local_628))
                                                                      ))))) == 0x3030303030303041) {
                        value_08._8_8_ = 1;
                        value_08.start_ = "1";
                        double_conversion::Bignum::AssignHexString(&local_224,value_08);
                        double_conversion::Bignum::AddUInt64(&local_224,0x10000000000);
                        bVar1 = double_conversion::Bignum::ToHexString(&local_224,&local_628,0x400);
                        if (!bVar1) {
                          uVar4 = 0xdc;
                          goto LAB_0081ed7d;
                        }
                        if (CONCAT13(cStack_61d,CONCAT12(cStack_61e,CONCAT11(cStack_61f,cStack_620))
                                    ) == 0x313030 &&
                            CONCAT17(cStack_621,
                                     CONCAT16(cStack_622,
                                              CONCAT15(cStack_623,
                                                       CONCAT14(cStack_624,
                                                                CONCAT13(cStack_625,
                                                                         CONCAT12(cStack_626,
                                                                                  CONCAT11(
                                                  cStack_627,local_628))))))) == 0x3030303030303031)
                        {
                          value_09._8_8_ = 1;
                          value_09.start_ = "1";
                          double_conversion::Bignum::AssignHexString(&local_224,value_09);
                          double_conversion::Bignum::AddUInt64(&local_224,0xffff00000000);
                          bVar1 = double_conversion::Bignum::ToHexString
                                            (&local_224,&local_628,0x400);
                          if (!bVar1) {
                            uVar4 = 0xe1;
                            goto LAB_0081ed7d;
                          }
                          if (CONCAT17(cStack_61c,
                                       CONCAT16(cStack_61d,
                                                CONCAT15(cStack_61e,
                                                         CONCAT14(cStack_61f,
                                                                  CONCAT13(cStack_620,
                                                                           CONCAT12(cStack_621,
                                                                                    CONCAT11(
                                                  cStack_622,cStack_623))))))) == 0x31303030303030
                              && CONCAT17(cStack_621,
                                          CONCAT16(cStack_622,
                                                   CONCAT15(cStack_623,
                                                            CONCAT14(cStack_624,
                                                                     CONCAT13(cStack_625,
                                                                              CONCAT12(cStack_626,
                                                                                       CONCAT11(
                                                  cStack_627,local_628))))))) == 0x3030303046464646)
                          {
                            value_10._8_8_ = 7;
                            value_10.start_ = "FFFFFFF";
                            double_conversion::Bignum::AssignHexString(&local_224,value_10);
                            double_conversion::Bignum::AddUInt64(&local_224,0x100000000);
                            bVar1 = double_conversion::Bignum::ToHexString
                                              (&local_224,&local_628,0x400);
                            if (!bVar1) {
                              uVar4 = 0xe6;
                              goto LAB_0081ed7d;
                            }
                            if (CONCAT11(cStack_61f,cStack_620) == 0x46 &&
                                CONCAT17(cStack_621,
                                         CONCAT16(cStack_622,
                                                  CONCAT15(cStack_623,
                                                           CONCAT14(cStack_624,
                                                                    CONCAT13(cStack_625,
                                                                             CONCAT12(cStack_626,
                                                                                      CONCAT11(
                                                  cStack_627,local_628))))))) == 0x4646464646463031)
                            {
                              value_11._8_8_ = 0x2c;
                              value_11.start_ = "10000000000000000000000000000000000000000000";
                              double_conversion::Bignum::AssignHexString(&local_224,value_11);
                              double_conversion::Bignum::AddUInt64(&local_224,0xffff00000000);
                              bVar1 = double_conversion::Bignum::ToHexString
                                                (&local_224,&local_628,0x400);
                              if (!bVar1) {
                                uVar4 = 0xeb;
                                goto LAB_0081ed7d;
                              }
                              iVar2 = bcmp("10000000000000000000000000000000FFFF00000000",&local_628
                                           ,0x2d);
                              if (iVar2 == 0) {
                                value_12._8_8_ = 0x2c;
                                value_12.start_ = "FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFF";
                                double_conversion::Bignum::AssignHexString(&local_224,value_12);
                                double_conversion::Bignum::AddUInt64(&local_224,0x100000000);
                                bVar1 = double_conversion::Bignum::ToHexString
                                                  (&local_224,&local_628,0x400);
                                if (!bVar1) {
                                  uVar4 = 0xf0;
                                  goto LAB_0081ed7d;
                                }
                                iVar2 = bcmp("1000000000000000000000000000000000000FFFFFFFF",
                                             &local_628,0x2e);
                                if (iVar2 == 0) {
                                  double_conversion::Bignum::AssignUInt16(&local_224,1);
                                  double_conversion::Bignum::ShiftLeft(&local_224,100);
                                  double_conversion::Bignum::AddUInt64(&local_224,0x100000000);
                                  bVar1 = double_conversion::Bignum::ToHexString
                                                    (&local_224,&local_628,0x400);
                                  if (!bVar1) {
                                    uVar4 = 0xf6;
                                    goto LAB_0081ed7d;
                                  }
                                  auVar12[0] = -(local_628 == '1');
                                  auVar12[1] = -(cStack_627 == '0');
                                  auVar12[2] = -(cStack_626 == '0');
                                  auVar12[3] = -(cStack_625 == '0');
                                  auVar12[4] = -(cStack_624 == '0');
                                  auVar12[5] = -(cStack_623 == '0');
                                  auVar12[6] = -(cStack_622 == '0');
                                  auVar12[7] = -(cStack_621 == '0');
                                  auVar12[8] = -(cStack_620 == '0');
                                  auVar12[9] = -(cStack_61f == '0');
                                  auVar12[10] = -(cStack_61e == '0');
                                  auVar12[0xb] = -(cStack_61d == '0');
                                  auVar12[0xc] = -(cStack_61c == '0');
                                  auVar12[0xd] = -(cStack_61b == '0');
                                  auVar12[0xe] = -(cStack_61a == '0');
                                  auVar12[0xf] = -(cStack_619 == '0');
                                  auVar8[0] = -(cStack_61d == '0');
                                  auVar8[1] = -(cStack_61c == '0');
                                  auVar8[2] = -(cStack_61b == '0');
                                  auVar8[3] = -(cStack_61a == '0');
                                  auVar8[4] = -(cStack_619 == '0');
                                  auVar8[5] = -(cStack_618 == '0');
                                  auVar8[6] = -(cStack_617 == '1');
                                  auVar8[7] = -(cStack_616 == '0');
                                  auVar8[8] = -(cStack_615 == '0');
                                  auVar8[9] = -(cStack_614 == '0');
                                  auVar8[10] = -(cStack_613 == '0');
                                  auVar8[0xb] = -(cStack_612 == '0');
                                  auVar8[0xc] = -(cStack_611 == '0');
                                  auVar8[0xd] = -(cStack_610 == '0');
                                  auVar8[0xe] = -(cStack_60f == '0');
                                  auVar8[0xf] = -(cStack_60e == '\0');
                                  auVar8 = auVar8 & auVar12;
                                  if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                                               (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                                               (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                                               (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                                               (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                                               (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                                               (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                                               (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                                               (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                                               (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                                               (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                                               (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                                               (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                                               (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                                               (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                                              (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) == 0xffff) {
                                    double_conversion::Bignum::AssignUInt16(&local_224,1);
                                    double_conversion::Bignum::ShiftLeft(&local_224,100);
                                    double_conversion::Bignum::AddUInt64(&local_224,0xffff00000000);
                                    bVar1 = double_conversion::Bignum::ToHexString
                                                      (&local_224,&local_628,0x400);
                                    if (!bVar1) {
                                      uVar4 = 0xfc;
                                      goto LAB_0081ed7d;
                                    }
                                    auVar13[0] = -(cStack_61d == '0');
                                    auVar13[1] = -(cStack_61c == '0');
                                    auVar13[2] = -(cStack_61b == '0');
                                    auVar13[3] = -(cStack_61a == 'F');
                                    auVar13[4] = -(cStack_619 == 'F');
                                    auVar13[5] = -(cStack_618 == 'F');
                                    auVar13[6] = -(cStack_617 == 'F');
                                    auVar13[7] = -(cStack_616 == '0');
                                    auVar13[8] = -(cStack_615 == '0');
                                    auVar13[9] = -(cStack_614 == '0');
                                    auVar13[10] = -(cStack_613 == '0');
                                    auVar13[0xb] = -(cStack_612 == '0');
                                    auVar13[0xc] = -(cStack_611 == '0');
                                    auVar13[0xd] = -(cStack_610 == '0');
                                    auVar13[0xe] = -(cStack_60f == '0');
                                    auVar13[0xf] = -(cStack_60e == '\0');
                                    auVar9[0] = -(local_628 == '1');
                                    auVar9[1] = -(cStack_627 == '0');
                                    auVar9[2] = -(cStack_626 == '0');
                                    auVar9[3] = -(cStack_625 == '0');
                                    auVar9[4] = -(cStack_624 == '0');
                                    auVar9[5] = -(cStack_623 == '0');
                                    auVar9[6] = -(cStack_622 == '0');
                                    auVar9[7] = -(cStack_621 == '0');
                                    auVar9[8] = -(cStack_620 == '0');
                                    auVar9[9] = -(cStack_61f == '0');
                                    auVar9[10] = -(cStack_61e == '0');
                                    auVar9[0xb] = -(cStack_61d == '0');
                                    auVar9[0xc] = -(cStack_61c == '0');
                                    auVar9[0xd] = -(cStack_61b == '0');
                                    auVar9[0xe] = -(cStack_61a == 'F');
                                    auVar9[0xf] = -(cStack_619 == 'F');
                                    auVar9 = auVar9 & auVar13;
                                    if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                                                 (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                                                 (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                                                 (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                                                 (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                                                 (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                                                 (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                                                 (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                                                 (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                                                 (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                                                 (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                                                 (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                                                 (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                                                 (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                                                 (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                                                (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) == 0xffff)
                                    {
                                      return;
                                    }
                                    pcVar3 = "\"10000000000000FFFF00000000\"";
                                    pcVar5 = "10000000000000FFFF00000000";
                                    uVar4 = 0xfd;
                                  }
                                  else {
                                    pcVar3 = "\"10000000000000000100000000\"";
                                    pcVar5 = "10000000000000000100000000";
                                    uVar4 = 0xf7;
                                  }
                                }
                                else {
                                  pcVar3 = "\"1000000000000000000000000000000000000FFFFFFFF\"";
                                  pcVar5 = "1000000000000000000000000000000000000FFFFFFFF";
                                  uVar4 = 0xf1;
                                }
                              }
                              else {
                                pcVar3 = "\"10000000000000000000000000000000FFFF00000000\"";
                                pcVar5 = "10000000000000000000000000000000FFFF00000000";
                                uVar4 = 0xec;
                              }
                            }
                            else {
                              pcVar3 = "\"10FFFFFFF\"";
                              pcVar5 = "10FFFFFFF";
                              uVar4 = 0xe7;
                            }
                          }
                          else {
                            pcVar3 = "\"FFFF00000001\"";
                            pcVar5 = "FFFF00000001";
                            uVar4 = 0xe2;
                          }
                        }
                        else {
                          pcVar3 = "\"10000000001\"";
                          pcVar5 = "10000000001";
                          uVar4 = 0xdd;
                        }
                      }
                      else {
                        pcVar3 = "\"A00000001\"";
                        pcVar5 = "A00000001";
                        uVar4 = 0xd8;
                      }
                    }
                    else {
                      pcVar3 = "\"A00000000\"";
                      pcVar5 = "A00000000";
                      uVar4 = 0xd3;
                    }
                  }
                  else {
                    pcVar3 = "\"1000000000000000000000FFFF\"";
                    pcVar5 = "1000000000000000000000FFFF";
                    uVar4 = 0xce;
                  }
                }
                else {
                  pcVar3 = "\"10000000000000000000000001\"";
                  pcVar5 = "10000000000000000000000001";
                  uVar4 = 200;
                }
              }
              else {
                pcVar3 = "\"100000000000000000000000000000000000000000000\"";
                pcVar5 = "100000000000000000000000000000000000000000000";
                uVar4 = 0xc2;
              }
            }
            else {
              pcVar3 = "\"1000000000000000000000000000000000000000FFFF\"";
              pcVar5 = "1000000000000000000000000000000000000000FFFF";
              uVar4 = 0xbd;
            }
          }
          else {
            pcVar3 = "\"10000000\"";
            pcVar5 = "10000000";
            uVar4 = 0xb8;
          }
        }
        else {
          pcVar3 = "\"10000\"";
          pcVar5 = "10000";
          uVar4 = 0xb3;
        }
      }
      else {
        pcVar3 = "\"101\"";
        pcVar5 = "101";
        uVar4 = 0xae;
      }
    }
    else {
      pcVar3 = "\"B\"";
      pcVar5 = "B";
      uVar4 = 0xa9;
    }
  }
  else {
    pcVar3 = "\"A\"";
    pcVar5 = "A";
    uVar4 = 0xa4;
  }
  printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %s\n#  Found:    %s\n",
         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-bignum.cc"
         ,uVar4,pcVar3,"buffer",pcVar5,&local_628);
  abort();
}

Assistant:

TEST(AddUInt64) {
  char buffer[kBufferSize];
  Bignum bignum;
  AssignHexString(&bignum, "0");
  bignum.AddUInt64(0xA);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("A", buffer);

  AssignHexString(&bignum, "1");
  bignum.AddUInt64(0xA);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("B", buffer);

  AssignHexString(&bignum, "1");
  bignum.AddUInt64(0x100);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("101", buffer);

  AssignHexString(&bignum, "1");
  bignum.AddUInt64(0xFFFF);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000", buffer);

  AssignHexString(&bignum, "FFFFFFF");
  bignum.AddUInt64(0x1);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000", buffer);

  AssignHexString(&bignum, "10000000000000000000000000000000000000000000");
  bignum.AddUInt64(0xFFFF);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1000000000000000000000000000000000000000FFFF", buffer);

  AssignHexString(&bignum, "FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFF");
  bignum.AddUInt64(0x1);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("100000000000000000000000000000000000000000000", buffer);

  bignum.AssignUInt16(0x1);
  bignum.ShiftLeft(100);
  bignum.AddUInt64(1);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000000000000000000001", buffer);

  bignum.AssignUInt16(0x1);
  bignum.ShiftLeft(100);
  bignum.AddUInt64(0xFFFF);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1000000000000000000000FFFF", buffer);

  AssignHexString(&bignum, "0");
  bignum.AddUInt64(DOUBLE_CONVERSION_UINT64_2PART_C(0xA, 00000000));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("A00000000", buffer);

  AssignHexString(&bignum, "1");
  bignum.AddUInt64(DOUBLE_CONVERSION_UINT64_2PART_C(0xA, 00000000));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("A00000001", buffer);

  AssignHexString(&bignum, "1");
  bignum.AddUInt64(DOUBLE_CONVERSION_UINT64_2PART_C(0x100, 00000000));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000001", buffer);

  AssignHexString(&bignum, "1");
  bignum.AddUInt64(DOUBLE_CONVERSION_UINT64_2PART_C(0xFFFF, 00000000));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("FFFF00000001", buffer);

  AssignHexString(&bignum, "FFFFFFF");
  bignum.AddUInt64(DOUBLE_CONVERSION_UINT64_2PART_C(0x1, 00000000));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10FFFFFFF", buffer);

  AssignHexString(&bignum, "10000000000000000000000000000000000000000000");
  bignum.AddUInt64(DOUBLE_CONVERSION_UINT64_2PART_C(0xFFFF, 00000000));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000000000000000000000000000FFFF00000000", buffer);

  AssignHexString(&bignum, "FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFF");
  bignum.AddUInt64(DOUBLE_CONVERSION_UINT64_2PART_C(0x1, 00000000));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1000000000000000000000000000000000000FFFFFFFF", buffer);

  bignum.AssignUInt16(0x1);
  bignum.ShiftLeft(100);
  bignum.AddUInt64(DOUBLE_CONVERSION_UINT64_2PART_C(0x1, 00000000));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000000000000100000000", buffer);

  bignum.AssignUInt16(0x1);
  bignum.ShiftLeft(100);
  bignum.AddUInt64(DOUBLE_CONVERSION_UINT64_2PART_C(0xFFFF, 00000000));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000000000FFFF00000000", buffer);
}